

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O3

void __thiscall tst_GenericModel::moveRowsTable(tst_GenericModel *this)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  QChar QVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  value_type args;
  QPersistentModelIndex oneIndex;
  GenericModel testModel;
  QPersistentModelIndex twoIndex;
  QSignalSpy *spyArr [2];
  anon_class_8_1_ce415857 resetData;
  ModelTest probe;
  QSignalSpy rowsAboutToBeMovedSpy;
  QSignalSpy rowsMovedSpy;
  anon_union_24_3_e3d07ef4_for_data local_1e8;
  undefined8 local_1d0;
  QChar local_1ba;
  QModelIndex local_1b8;
  QChar local_19a;
  QChar local_198 [4];
  QModelIndex local_190;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  QPersistentModelIndex local_160 [8];
  QSignalSpy *local_158 [2];
  anon_class_8_1_ce415857 local_148;
  undefined **local_140 [2];
  QSignalSpy local_130;
  QSignalSpy local_b0;
  
  GenericModel::GenericModel((GenericModel *)&local_190,(QObject *)0x0);
  QAbstractItemModelTester::QAbstractItemModelTester
            ((QAbstractItemModelTester *)local_140,(QAbstractItemModel *)&local_190,QtTest,
             (QObject *)0x0);
  local_140[0] = &PTR_metaObject_001659f8;
  local_130.super_QObject = (QObject)0xff;
  local_130._1_7_ = 0xffffffffffffff;
  local_130._8_8_ = 0;
  local_130.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertColumns((int)&local_190,0,(QModelIndex *)0x2);
  local_130.super_QObject = (QObject)0xff;
  local_130._1_7_ = 0xffffffffffffff;
  local_130._8_8_ = 0;
  local_130.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertRows((int)&local_190,0,(QModelIndex *)0x6);
  QSignalSpy::QSignalSpy
            (&local_130,(QObject *)&local_190,
             "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(local_130.sig.d.size != 0,"rowsAboutToBeMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x5e8);
  if (cVar2 == '\0') goto LAB_00121e88;
  QSignalSpy::QSignalSpy
            (&local_b0,(QObject *)&local_190,"2rowsMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(local_b0.sig.d.size != 0,"rowsMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x5ea);
  if (cVar2 != '\0') {
    local_158[0] = &local_130;
    local_158[1] = &local_b0;
    local_148.testModel = (GenericModel *)&local_190;
    moveRowsTable::anon_class_8_1_ce415857::operator()(&local_148);
    local_1e8._forAlignment = -NAN;
    local_1e8._8_8_ = (QVariant *)0x0;
    local_1e8._16_8_ = 0;
    local_1b8.r = -1;
    local_1b8.c = -1;
    local_1b8.i = 0;
    local_1b8.m = (QAbstractItemModel *)0x0;
    iVar7 = (int)&local_1e8;
    bVar3 = GenericModel::moveRows(&local_190,iVar7,2,(QModelIndex *)0x1,(int)&local_1b8);
    cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                           "!testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), -1)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x5f3);
    if (cVar2 != '\0') {
      lVar8 = 0;
      do {
        cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)local_158 + lVar8) + 0x20),0,
                                "spy->count()","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x5f5);
        if (cVar2 == '\0') goto LAB_00121e01;
        lVar8 = lVar8 + 8;
      } while (lVar8 != 0x10);
      local_1e8._forAlignment = -NAN;
      local_1e8._8_8_ = (QVariant *)0x0;
      local_1e8._16_8_ = 0;
      local_1b8.r = -1;
      local_1b8.c = -1;
      local_1b8.i = 0;
      local_1b8.m = (QAbstractItemModel *)0x0;
      bVar3 = GenericModel::moveRows(&local_190,iVar7,2,(QModelIndex *)0x1,(int)&local_1b8);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                             "!testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 7)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x5f6);
      if (cVar2 != '\0') {
        lVar8 = 0;
        do {
          cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)local_158 + lVar8) + 0x20),0,
                                  "spy->count()","0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x5f8);
          if (cVar2 == '\0') goto LAB_00121e01;
          lVar8 = lVar8 + 8;
        } while (lVar8 != 0x10);
        local_1e8._forAlignment = -NAN;
        local_1e8._8_8_ = (QVariant *)0x0;
        local_1e8._16_8_ = 0;
        local_1b8.r = -1;
        local_1b8.c = -1;
        local_1b8.i = 0;
        local_1b8.m = (QAbstractItemModel *)0x0;
        bVar3 = GenericModel::moveRows(&local_190,iVar7,-1,(QModelIndex *)0x1,(int)&local_1b8);
        cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                               "!testModel.moveRows(QModelIndex(), -1, 1, QModelIndex(), 3)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x5f9);
        if (cVar2 != '\0') {
          lVar8 = 0;
          do {
            cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)local_158 + lVar8) + 0x20),0,
                                    "spy->count()","0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x5fb);
            if (cVar2 == '\0') goto LAB_00121e01;
            lVar8 = lVar8 + 8;
          } while (lVar8 != 0x10);
          local_1e8._forAlignment = -NAN;
          local_1e8._8_8_ = (QVariant *)0x0;
          local_1e8._16_8_ = 0;
          local_1b8.r = -1;
          local_1b8.c = -1;
          local_1b8.i = 0;
          local_1b8.m = (QAbstractItemModel *)0x0;
          bVar3 = GenericModel::moveRows(&local_190,iVar7,6,(QModelIndex *)0x1,(int)&local_1b8);
          cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                 "!testModel.moveRows(QModelIndex(), 6, 1, QModelIndex(), 3)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x5fc);
          if (cVar2 != '\0') {
            lVar8 = 0;
            do {
              cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)local_158 + lVar8) + 0x20),0,
                                      "spy->count()","0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x5fe);
              if (cVar2 == '\0') goto LAB_00121e01;
              lVar8 = lVar8 + 8;
            } while (lVar8 != 0x10);
            local_1e8._forAlignment = -NAN;
            local_1e8._8_8_ = (QVariant *)0x0;
            local_1e8._16_8_ = 0;
            local_1b8.r = -1;
            local_1b8.c = -1;
            local_1b8.i = 0;
            local_1b8.m = (QAbstractItemModel *)0x0;
            bVar3 = GenericModel::moveRows(&local_190,iVar7,1,(QModelIndex *)0x2,(int)&local_1b8);
            cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                   "!testModel.moveRows(QModelIndex(), 1, 2, QModelIndex(), 2)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x5ff);
            if (cVar2 != '\0') {
              lVar8 = 0;
              do {
                cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)local_158 + lVar8) + 0x20),0,
                                        "spy->count()","0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x601);
                if (cVar2 == '\0') goto LAB_00121e01;
                lVar8 = lVar8 + 8;
              } while (lVar8 != 0x10);
              local_1e8._forAlignment = -NAN;
              local_1e8._8_8_ = (QVariant *)0x0;
              local_1e8._16_8_ = 0;
              local_1b8.r = -1;
              local_1b8.c = -1;
              local_1b8.i = 0;
              local_1b8.m = (QAbstractItemModel *)0x0;
              bVar3 = GenericModel::moveRows(&local_190,iVar7,1,(QModelIndex *)0x2,(int)&local_1b8);
              cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                     "!testModel.moveRows(QModelIndex(), 1, 2, QModelIndex(), 3)",""
                                     ,
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x602);
              if (cVar2 != '\0') {
                lVar8 = 0;
                do {
                  cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)local_158 + lVar8) + 0x20),0
                                          ,"spy->count()","0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x604);
                  if (cVar2 == '\0') goto LAB_00121e01;
                  lVar8 = lVar8 + 8;
                } while (lVar8 != 0x10);
                local_1b8.r = -1;
                local_1b8.c = -1;
                local_1b8.i = 0;
                local_1b8.m = (QAbstractItemModel *)0x0;
                GenericModel::index(iVar7,(int)&local_190,(QModelIndex *)0x2);
                QPersistentModelIndex::QPersistentModelIndex(local_160,(QModelIndex *)&local_1e8);
                local_1e8._forAlignment = -NAN;
                local_1e8._8_8_ = (QVariant *)0x0;
                local_1e8._16_8_ = 0;
                local_1b8.r = -1;
                local_1b8.c = -1;
                local_1b8.i = 0;
                local_1b8.m = (QAbstractItemModel *)0x0;
                bVar4 = (bool)GenericModel::moveRows
                                        (&local_190,iVar7,2,(QModelIndex *)0x1,(int)&local_1b8);
                cVar2 = QTest::qVerify(bVar4,
                                       "testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 4)",
                                       "",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x607);
                if (cVar2 != '\0') {
                  local_178 = 0xffffffffffffffff;
                  local_170 = 0;
                  uStack_168 = 0;
                  GenericModel::index((int)&local_1b8,(int)&local_190,(QModelIndex *)0x0);
                  if (local_1b8.m == (QAbstractItemModel *)0x0) {
                    local_1e8.shared = (PrivateShared *)0x0;
                    local_1e8._8_8_ = (QVariant *)0x0;
                    local_1e8._16_8_ = 0;
                    local_1d0 = 2;
                  }
                  else {
                    (**(code **)(*(long *)local_1b8.m + 0x90))(&local_1e8,local_1b8.m,&local_1b8,0);
                  }
                  iVar6 = QVariant::toInt((bool *)local_1e8.data);
                  cVar2 = QTest::qCompare(iVar6,0,"testModel.index(0, 0).data().toInt()","0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x608);
                  QVariant::~QVariant((QVariant *)&local_1e8);
                  if (cVar2 != '\0') {
                    local_178 = 0xffffffffffffffff;
                    local_170 = 0;
                    uStack_168 = 0;
                    GenericModel::index((int)&local_1b8,(int)&local_190,(QModelIndex *)0x1);
                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                      local_1e8.shared = (PrivateShared *)0x0;
                      local_1e8._8_8_ = (QVariant *)0x0;
                      local_1e8._16_8_ = 0;
                      local_1d0 = 2;
                    }
                    else {
                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                (&local_1e8,local_1b8.m,&local_1b8,0);
                    }
                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                    cVar2 = QTest::qCompare(iVar6,1,"testModel.index(1, 0).data().toInt()","1",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x609);
                    QVariant::~QVariant((QVariant *)&local_1e8);
                    if (cVar2 != '\0') {
                      local_178 = 0xffffffffffffffff;
                      local_170 = 0;
                      uStack_168 = 0;
                      GenericModel::index((int)&local_1b8,(int)&local_190,(QModelIndex *)0x2);
                      if (local_1b8.m == (QAbstractItemModel *)0x0) {
                        local_1e8.shared = (PrivateShared *)0x0;
                        local_1e8._8_8_ = (QVariant *)0x0;
                        local_1e8._16_8_ = 0;
                        local_1d0 = 2;
                      }
                      else {
                        (**(code **)(*(long *)local_1b8.m + 0x90))
                                  (&local_1e8,local_1b8.m,&local_1b8,0);
                      }
                      iVar6 = QVariant::toInt((bool *)local_1e8.data);
                      cVar2 = QTest::qCompare(iVar6,3,"testModel.index(2, 0).data().toInt()","3",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x60a);
                      QVariant::~QVariant((QVariant *)&local_1e8);
                      if (cVar2 != '\0') {
                        local_178 = 0xffffffffffffffff;
                        local_170 = 0;
                        uStack_168 = 0;
                        GenericModel::index((int)&local_1b8,(int)&local_190,(QModelIndex *)0x3);
                        if (local_1b8.m == (QAbstractItemModel *)0x0) {
                          local_1e8.shared = (PrivateShared *)0x0;
                          local_1e8._8_8_ = (QVariant *)0x0;
                          local_1e8._16_8_ = 0;
                          local_1d0 = 2;
                        }
                        else {
                          (**(code **)(*(long *)local_1b8.m + 0x90))
                                    (&local_1e8,local_1b8.m,&local_1b8,0);
                        }
                        iVar6 = QVariant::toInt((bool *)local_1e8.data);
                        cVar2 = QTest::qCompare(iVar6,2,"testModel.index(3, 0).data().toInt()","2",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x60b);
                        QVariant::~QVariant((QVariant *)&local_1e8);
                        if (cVar2 != '\0') {
                          local_178 = 0xffffffffffffffff;
                          local_170 = 0;
                          uStack_168 = 0;
                          GenericModel::index((int)&local_1b8,(int)&local_190,(QModelIndex *)0x4);
                          if (local_1b8.m == (QAbstractItemModel *)0x0) {
                            local_1e8.shared = (PrivateShared *)0x0;
                            local_1e8._8_8_ = (QVariant *)0x0;
                            local_1e8._16_8_ = 0;
                            local_1d0 = 2;
                          }
                          else {
                            (**(code **)(*(long *)local_1b8.m + 0x90))
                                      (&local_1e8,local_1b8.m,&local_1b8,0);
                          }
                          iVar6 = QVariant::toInt((bool *)local_1e8.data);
                          cVar2 = QTest::qCompare(iVar6,4,"testModel.index(4, 0).data().toInt()","4"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x60c);
                          QVariant::~QVariant((QVariant *)&local_1e8);
                          if (cVar2 != '\0') {
                            local_178 = 0xffffffffffffffff;
                            local_170 = 0;
                            uStack_168 = 0;
                            GenericModel::index((int)&local_1b8,(int)&local_190,(QModelIndex *)0x5);
                            if (local_1b8.m == (QAbstractItemModel *)0x0) {
                              local_1e8.shared = (PrivateShared *)0x0;
                              local_1e8._8_8_ = (QVariant *)0x0;
                              local_1e8._16_8_ = 0;
                              local_1d0 = 2;
                            }
                            else {
                              (**(code **)(*(long *)local_1b8.m + 0x90))
                                        (&local_1e8,local_1b8.m,&local_1b8,0);
                            }
                            iVar6 = QVariant::toInt((bool *)local_1e8.data);
                            cVar2 = QTest::qCompare(iVar6,5,"testModel.index(5, 0).data().toInt()",
                                                    "5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x60d);
                            QVariant::~QVariant((QVariant *)&local_1e8);
                            if (cVar2 != '\0') {
                              local_178 = 0xffffffffffffffff;
                              local_170 = 0;
                              uStack_168 = 0;
                              GenericModel::index((int)&local_1b8,(int)&local_190,(QModelIndex *)0x0
                                                 );
                              if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                local_1e8.shared = (PrivateShared *)0x0;
                                local_1e8._8_8_ = (QVariant *)0x0;
                                local_1e8._16_8_ = 0;
                                local_1d0 = 2;
                              }
                              else {
                                (**(code **)(*(long *)local_1b8.m + 0x90))
                                          (&local_1e8,local_1b8.m,&local_1b8,0);
                              }
                              local_198[0] = QVariant::value<QChar>((QVariant *)&local_1e8);
                              local_1ba.ucs = L'a';
                              bVar4 = QTest::qCompare<QChar,QChar>
                                                (local_198,&local_1ba,
                                                 "testModel.index(0, 1).data().value<QChar>()",
                                                 "QChar(QLatin1Char(\'a\'))",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                 ,0x60e);
                              QVariant::~QVariant((QVariant *)&local_1e8);
                              if (bVar4) {
                                local_178 = 0xffffffffffffffff;
                                local_170 = 0;
                                uStack_168 = 0;
                                GenericModel::index((int)&local_1b8,(int)&local_190,
                                                    (QModelIndex *)0x1);
                                if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                  local_1e8.shared = (PrivateShared *)0x0;
                                  local_1e8._8_8_ = (QVariant *)0x0;
                                  local_1e8._16_8_ = 0;
                                  local_1d0 = 2;
                                }
                                else {
                                  (**(code **)(*(long *)local_1b8.m + 0x90))
                                            (&local_1e8,local_1b8.m,&local_1b8,0);
                                }
                                local_198[0] = QVariant::value<QChar>((QVariant *)&local_1e8);
                                local_1ba.ucs = L'b';
                                bVar4 = QTest::qCompare<QChar,QChar>
                                                  (local_198,&local_1ba,
                                                   "testModel.index(1, 1).data().value<QChar>()",
                                                   "QChar(QLatin1Char(\'b\'))",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x60f);
                                QVariant::~QVariant((QVariant *)&local_1e8);
                                if (bVar4) {
                                  local_178 = 0xffffffffffffffff;
                                  local_170 = 0;
                                  uStack_168 = 0;
                                  GenericModel::index((int)&local_1b8,(int)&local_190,
                                                      (QModelIndex *)0x2);
                                  if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                    local_1e8.shared = (PrivateShared *)0x0;
                                    local_1e8._8_8_ = (QVariant *)0x0;
                                    local_1e8._16_8_ = 0;
                                    local_1d0 = 2;
                                  }
                                  else {
                                    (**(code **)(*(long *)local_1b8.m + 0x90))
                                              (&local_1e8,local_1b8.m,&local_1b8,0);
                                  }
                                  local_198[0] = QVariant::value<QChar>((QVariant *)&local_1e8);
                                  local_1ba.ucs = L'd';
                                  bVar4 = QTest::qCompare<QChar,QChar>
                                                    (local_198,&local_1ba,
                                                     "testModel.index(2, 1).data().value<QChar>()",
                                                     "QChar(QLatin1Char(\'d\'))",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x610);
                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                  if (bVar4) {
                                    local_178 = 0xffffffffffffffff;
                                    local_170 = 0;
                                    uStack_168 = 0;
                                    GenericModel::index((int)&local_1b8,(int)&local_190,
                                                        (QModelIndex *)0x3);
                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                      local_1e8.shared = (PrivateShared *)0x0;
                                      local_1e8._8_8_ = (QVariant *)0x0;
                                      local_1e8._16_8_ = 0;
                                      local_1d0 = 2;
                                    }
                                    else {
                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                (&local_1e8,local_1b8.m,&local_1b8,0);
                                    }
                                    local_198[0] = QVariant::value<QChar>((QVariant *)&local_1e8);
                                    local_1ba.ucs = L'c';
                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                      (local_198,&local_1ba,
                                                       "testModel.index(3, 1).data().value<QChar>()"
                                                       ,"QChar(QLatin1Char(\'c\'))",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x611);
                                    QVariant::~QVariant((QVariant *)&local_1e8);
                                    if (bVar4) {
                                      local_178 = 0xffffffffffffffff;
                                      local_170 = 0;
                                      uStack_168 = 0;
                                      GenericModel::index((int)&local_1b8,(int)&local_190,
                                                          (QModelIndex *)0x4);
                                      if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                        local_1e8.shared = (PrivateShared *)0x0;
                                        local_1e8._8_8_ = (QVariant *)0x0;
                                        local_1e8._16_8_ = 0;
                                        local_1d0 = 2;
                                      }
                                      else {
                                        (**(code **)(*(long *)local_1b8.m + 0x90))
                                                  (&local_1e8,local_1b8.m,&local_1b8,0);
                                      }
                                      local_198[0] = QVariant::value<QChar>((QVariant *)&local_1e8);
                                      local_1ba.ucs = L'e';
                                      bVar4 = QTest::qCompare<QChar,QChar>
                                                        (local_198,&local_1ba,
                                                                                                                  
                                                  "testModel.index(4, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x612);
                                      QVariant::~QVariant((QVariant *)&local_1e8);
                                      if (bVar4) {
                                        local_178 = 0xffffffffffffffff;
                                        local_170 = 0;
                                        uStack_168 = 0;
                                        GenericModel::index((int)&local_1b8,(int)&local_190,
                                                            (QModelIndex *)0x5);
                                        if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                          local_1e8.shared = (PrivateShared *)0x0;
                                          local_1e8._8_8_ = (QVariant *)0x0;
                                          local_1e8._16_8_ = 0;
                                          local_1d0 = 2;
                                        }
                                        else {
                                          (**(code **)(*(long *)local_1b8.m + 0x90))
                                                    (&local_1e8,local_1b8.m,&local_1b8,0);
                                        }
                                        local_198[0] = QVariant::value<QChar>
                                                                 ((QVariant *)&local_1e8);
                                        local_1ba.ucs = L'f';
                                        bVar4 = QTest::qCompare<QChar,QChar>
                                                          (local_198,&local_1ba,
                                                                                                                      
                                                  "testModel.index(5, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x613);
                                        QVariant::~QVariant((QVariant *)&local_1e8);
                                        if (bVar4) {
                                          QPersistentModelIndex::data(iVar7);
                                          QVar5 = QVariant::value<QChar>((QVariant *)&local_1e8);
                                          local_1b8.r._0_2_ = QVar5.ucs;
                                          local_178 = CONCAT62(local_178._2_6_,99);
                                          bVar4 = QTest::qCompare<QChar,QChar>
                                                            ((QChar *)&local_1b8,(QChar *)&local_178
                                                             ,"twoIndex.data().value<QChar>()",
                                                             "QChar(QLatin1Char(\'c\'))",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x614);
                                          QVariant::~QVariant((QVariant *)&local_1e8);
                                          if (bVar4) {
                                            iVar6 = QPersistentModelIndex::row();
                                            cVar2 = QTest::qCompare(iVar6,3,"twoIndex.row()","3",
                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x615);
                                            if (cVar2 != '\0') {
                                              lVar8 = 0;
                                              do {
                                                lVar1 = *(long *)((long)local_158 + lVar8);
                                                cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),
                                                                        1,"spy->count()","1",
                                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x617);
                                                if (cVar2 == '\0') goto LAB_00121df4;
                                                QList<QList<QVariant>_>::takeFirst
                                                          ((value_type *)&local_1e8,
                                                           (QList<QList<QVariant>_> *)(lVar1 + 0x10)
                                                          );
                                                QVariant::value<QModelIndex>
                                                          (&local_1b8,(QVariant *)local_1e8._8_8_);
                                                bVar4 = true;
                                                if ((-1 < local_1b8.r) &&
                                                   (-1 < (long)local_1b8._0_8_)) {
                                                  bVar4 = local_1b8.m == (QAbstractItemModel *)0x0;
                                                }
                                                cVar2 = QTest::qVerify(bVar4,
                                                  "!args.at(0).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x619);
                                                if (cVar2 == '\0') goto LAB_00121dec;
                                                iVar6 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                0x20));
                                                cVar2 = QTest::qCompare(iVar6,2,"args.at(1).toInt()"
                                                                        ,"2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x61a);
                                                if (cVar2 == '\0') goto LAB_00121dec;
                                                iVar6 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                0x40));
                                                cVar2 = QTest::qCompare(iVar6,2,"args.at(2).toInt()"
                                                                        ,"2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x61b);
                                                if (cVar2 == '\0') goto LAB_00121dec;
                                                QVariant::value<QModelIndex>
                                                          (&local_1b8,
                                                           (QVariant *)(local_1e8._8_8_ + 0x60));
                                                bVar4 = true;
                                                if ((-1 < local_1b8.r) &&
                                                   (-1 < (long)local_1b8._0_8_)) {
                                                  bVar4 = local_1b8.m == (QAbstractItemModel *)0x0;
                                                }
                                                cVar2 = QTest::qVerify(bVar4,
                                                  "!args.at(3).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x61c);
                                                if (cVar2 == '\0') goto LAB_00121dec;
                                                iVar6 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                0x80));
                                                cVar2 = QTest::qCompare(iVar6,4,"args.at(4).toInt()"
                                                                        ,"4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x61d);
                                                QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                          ((QArrayDataPointer<QVariant> *)&local_1e8
                                                          );
                                                if (cVar2 == '\0') goto LAB_00121df4;
                                                lVar8 = lVar8 + 8;
                                              } while (lVar8 != 0x10);
                                              moveRowsTable::anon_class_8_1_ce415857::operator()
                                                        (&local_148);
                                              local_1b8.r = -1;
                                              local_1b8.c = -1;
                                              local_1b8.i = 0;
                                              local_1b8.m = (QAbstractItemModel *)0x0;
                                              GenericModel::index(iVar7,(int)&local_190,
                                                                  (QModelIndex *)0x2);
                                              QPersistentModelIndex::operator=
                                                        (local_160,(QModelIndex *)&local_1e8);
                                              local_1e8._forAlignment = -NAN;
                                              local_1e8._8_8_ = (QVariant *)0x0;
                                              local_1e8._16_8_ = 0;
                                              local_1b8.r = -1;
                                              local_1b8.c = -1;
                                              local_1b8.i = 0;
                                              local_1b8.m = (QAbstractItemModel *)0x0;
                                              bVar4 = (bool)GenericModel::moveRows
                                                                      (&local_190,iVar7,2,
                                                                       (QModelIndex *)0x1,
                                                                       (int)&local_1b8);
                                              cVar2 = QTest::qVerify(bVar4,
                                                  "testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 0)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x622);
                                              if (cVar2 != '\0') {
                                                local_178 = 0xffffffffffffffff;
                                                local_170 = 0;
                                                uStack_168 = 0;
                                                GenericModel::index((int)&local_1b8,(int)&local_190,
                                                                    (QModelIndex *)0x0);
                                                if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                  local_1e8.shared = (PrivateShared *)0x0;
                                                  local_1e8._8_8_ = (QVariant *)0x0;
                                                  local_1e8._16_8_ = 0;
                                                  local_1d0 = 2;
                                                }
                                                else {
                                                  (**(code **)(*(long *)local_1b8.m + 0x90))
                                                            (&local_1e8,local_1b8.m,&local_1b8,0);
                                                }
                                                iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                cVar2 = QTest::qCompare(iVar6,2,
                                                  "testModel.index(0, 0).data().toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x623);
                                                QVariant::~QVariant((QVariant *)&local_1e8);
                                                if (cVar2 != '\0') {
                                                  local_178 = 0xffffffffffffffff;
                                                  local_170 = 0;
                                                  uStack_168 = 0;
                                                  GenericModel::index((int)&local_1b8,
                                                                      (int)&local_190,
                                                                      (QModelIndex *)0x1);
                                                  if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                    local_1e8.shared = (PrivateShared *)0x0;
                                                    local_1e8._8_8_ = (QVariant *)0x0;
                                                    local_1e8._16_8_ = 0;
                                                    local_1d0 = 2;
                                                  }
                                                  else {
                                                    (**(code **)(*(long *)local_1b8.m + 0x90))
                                                              (&local_1e8,local_1b8.m,&local_1b8,0);
                                                  }
                                                  iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                  cVar2 = QTest::qCompare(iVar6,0,
                                                  "testModel.index(1, 0).data().toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x624);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x2);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar6,1,
                                                  "testModel.index(2, 0).data().toInt()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x625);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x3);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar6,3,
                                                  "testModel.index(3, 0).data().toInt()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x626);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x4);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar6,4,
                                                  "testModel.index(4, 0).data().toInt()","4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x627);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x5);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar6,5,
                                                  "testModel.index(5, 0).data().toInt()","5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x628);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x0);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_198[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ba.ucs = L'c';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_198,&local_1ba,
                                                                                                                                              
                                                  "testModel.index(0, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x629);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x1);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_198[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ba.ucs = L'a';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_198,&local_1ba,
                                                                                                                                              
                                                  "testModel.index(1, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'a\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x62a);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x2);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_198[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ba.ucs = L'b';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_198,&local_1ba,
                                                                                                                                              
                                                  "testModel.index(2, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x62b);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x3);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_198[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ba.ucs = L'd';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_198,&local_1ba,
                                                                                                                                              
                                                  "testModel.index(3, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x62c);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x4);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_198[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ba.ucs = L'e';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_198,&local_1ba,
                                                                                                                                              
                                                  "testModel.index(4, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x62d);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x5);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_198[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ba.ucs = L'f';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_198,&local_1ba,
                                                                                                                                              
                                                  "testModel.index(5, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x62e);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    QPersistentModelIndex::data(iVar7);
                                                    QVar5 = QVariant::value<QChar>
                                                                      ((QVariant *)&local_1e8);
                                                    local_1b8.r._0_2_ = QVar5.ucs;
                                                    local_178 = CONCAT62(local_178._2_6_,99);
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      ((QChar *)&local_1b8,
                                                                       (QChar *)&local_178,
                                                                                                                                              
                                                  "twoIndex.data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x62f);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    iVar6 = QPersistentModelIndex::row();
                                                    cVar2 = QTest::qCompare(iVar6,0,"twoIndex.row()"
                                                                            ,"0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x630);
                                                  if (cVar2 != '\0') {
                                                    lVar8 = 0;
                                                    do {
                                                      lVar1 = *(long *)((long)local_158 + lVar8);
                                                      cVar2 = QTest::qCompare(*(longlong *)
                                                                               (lVar1 + 0x20),1,
                                                                              "spy->count()","1",
                                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x632);
                                                  if (cVar2 == '\0') goto LAB_00121df4;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)&local_1e8,
                                                             (QList<QList<QVariant>_> *)
                                                             (lVar1 + 0x10));
                                                  QVariant::value<QModelIndex>
                                                            (&local_1b8,(QVariant *)local_1e8._8_8_)
                                                  ;
                                                  bVar4 = true;
                                                  if ((-1 < local_1b8.r) &&
                                                     (-1 < (long)local_1b8._0_8_)) {
                                                    bVar4 = local_1b8.m == (QAbstractItemModel *)0x0
                                                    ;
                                                  }
                                                  cVar2 = QTest::qVerify(bVar4,
                                                  "!args.at(0).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x634);
                                                  if (cVar2 == '\0') goto LAB_00121dec;
                                                  iVar6 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x20));
                                                  cVar2 = QTest::qCompare(iVar6,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x635);
                                                  if (cVar2 == '\0') goto LAB_00121dec;
                                                  iVar6 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x40));
                                                  cVar2 = QTest::qCompare(iVar6,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x636);
                                                  if (cVar2 == '\0') goto LAB_00121dec;
                                                  QVariant::value<QModelIndex>
                                                            (&local_1b8,
                                                             (QVariant *)(local_1e8._8_8_ + 0x60));
                                                  bVar4 = true;
                                                  if ((-1 < local_1b8.r) &&
                                                     (-1 < (long)local_1b8._0_8_)) {
                                                    bVar4 = local_1b8.m == (QAbstractItemModel *)0x0
                                                    ;
                                                  }
                                                  cVar2 = QTest::qVerify(bVar4,
                                                  "!args.at(3).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x637);
                                                  if (cVar2 == '\0') goto LAB_00121dec;
                                                  iVar6 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x80));
                                                  cVar2 = QTest::qCompare(iVar6,0,
                                                  "args.at(4).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x638);
                                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                            ((QArrayDataPointer<QVariant> *)
                                                             &local_1e8);
                                                  if (cVar2 == '\0') goto LAB_00121df4;
                                                  lVar8 = lVar8 + 8;
                                                  } while (lVar8 != 0x10);
                                                  moveRowsTable::anon_class_8_1_ce415857::operator()
                                                            (&local_148);
                                                  local_1b8.r = -1;
                                                  local_1b8.c = -1;
                                                  local_1b8.i = 0;
                                                  local_1b8.m = (QAbstractItemModel *)0x0;
                                                  GenericModel::index(iVar7,(int)&local_190,
                                                                      (QModelIndex *)0x2);
                                                  QPersistentModelIndex::operator=
                                                            (local_160,(QModelIndex *)&local_1e8);
                                                  local_1e8._forAlignment = -NAN;
                                                  local_1e8._8_8_ = (QVariant *)0x0;
                                                  local_1e8._16_8_ = 0;
                                                  local_1b8.r = -1;
                                                  local_1b8.c = -1;
                                                  local_1b8.i = 0;
                                                  local_1b8.m = (QAbstractItemModel *)0x0;
                                                  bVar4 = (bool)GenericModel::moveRows
                                                                          (&local_190,iVar7,2,
                                                                           (QModelIndex *)0x1,
                                                                           (int)&local_1b8);
                                                  cVar2 = QTest::qVerify(bVar4,
                                                  "testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 6)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x63d);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x0);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar6,0,
                                                  "testModel.index(0, 0).data().toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x63e);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x1);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar6,1,
                                                  "testModel.index(1, 0).data().toInt()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x63f);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x2);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar6,3,
                                                  "testModel.index(2, 0).data().toInt()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x640);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x3);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar6,4,
                                                  "testModel.index(3, 0).data().toInt()","4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x641);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x4);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar6,5,
                                                  "testModel.index(4, 0).data().toInt()","5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x642);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x5);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar6,2,
                                                  "testModel.index(5, 0).data().toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x643);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x0);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_198[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ba.ucs = L'a';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_198,&local_1ba,
                                                                                                                                              
                                                  "testModel.index(0, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'a\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x644);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x1);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_198[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ba.ucs = L'b';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_198,&local_1ba,
                                                                                                                                              
                                                  "testModel.index(1, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x645);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x2);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_198[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ba.ucs = L'd';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_198,&local_1ba,
                                                                                                                                              
                                                  "testModel.index(2, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x646);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x3);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_198[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ba.ucs = L'e';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_198,&local_1ba,
                                                                                                                                              
                                                  "testModel.index(3, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x647);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x4);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_198[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ba.ucs = L'f';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_198,&local_1ba,
                                                                                                                                              
                                                  "testModel.index(4, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x648);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x5);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_198[0] = QVariant::value<QChar>
                                                                             ((QVariant *)&local_1e8
                                                                             );
                                                    local_1ba.ucs = L'c';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (local_198,&local_1ba,
                                                                                                                                              
                                                  "testModel.index(5, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x649);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    QPersistentModelIndex::data(iVar7);
                                                    QVar5 = QVariant::value<QChar>
                                                                      ((QVariant *)&local_1e8);
                                                    local_1b8.r._0_2_ = QVar5.ucs;
                                                    local_178 = CONCAT62(local_178._2_6_,99);
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      ((QChar *)&local_1b8,
                                                                       (QChar *)&local_178,
                                                                                                                                              
                                                  "twoIndex.data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x64a);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    iVar6 = QPersistentModelIndex::row();
                                                    cVar2 = QTest::qCompare(iVar6,5,"twoIndex.row()"
                                                                            ,"5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x64b);
                                                  if (cVar2 != '\0') {
                                                    lVar8 = 0;
                                                    do {
                                                      lVar1 = *(long *)((long)local_158 + lVar8);
                                                      cVar2 = QTest::qCompare(*(longlong *)
                                                                               (lVar1 + 0x20),1,
                                                                              "spy->count()","1",
                                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x64d);
                                                  if (cVar2 == '\0') goto LAB_00121df4;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)&local_1e8,
                                                             (QList<QList<QVariant>_> *)
                                                             (lVar1 + 0x10));
                                                  QVariant::value<QModelIndex>
                                                            (&local_1b8,(QVariant *)local_1e8._8_8_)
                                                  ;
                                                  bVar4 = true;
                                                  if ((-1 < local_1b8.r) &&
                                                     (-1 < (long)local_1b8._0_8_)) {
                                                    bVar4 = local_1b8.m == (QAbstractItemModel *)0x0
                                                    ;
                                                  }
                                                  cVar2 = QTest::qVerify(bVar4,
                                                  "!args.at(0).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x64f);
                                                  if (cVar2 == '\0') goto LAB_00121dec;
                                                  iVar6 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x20));
                                                  cVar2 = QTest::qCompare(iVar6,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x650);
                                                  if (cVar2 == '\0') goto LAB_00121dec;
                                                  iVar6 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x40));
                                                  cVar2 = QTest::qCompare(iVar6,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x651);
                                                  if (cVar2 == '\0') goto LAB_00121dec;
                                                  QVariant::value<QModelIndex>
                                                            (&local_1b8,
                                                             (QVariant *)(local_1e8._8_8_ + 0x60));
                                                  bVar4 = true;
                                                  if ((-1 < local_1b8.r) &&
                                                     (-1 < (long)local_1b8._0_8_)) {
                                                    bVar4 = local_1b8.m == (QAbstractItemModel *)0x0
                                                    ;
                                                  }
                                                  cVar2 = QTest::qVerify(bVar4,
                                                  "!args.at(3).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x652);
                                                  if (cVar2 == '\0') goto LAB_00121dec;
                                                  iVar6 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x80));
                                                  cVar2 = QTest::qCompare(iVar6,6,
                                                  "args.at(4).toInt()","6",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x653);
                                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                            ((QArrayDataPointer<QVariant> *)
                                                             &local_1e8);
                                                  if (cVar2 == '\0') goto LAB_00121df4;
                                                  lVar8 = lVar8 + 8;
                                                  } while (lVar8 != 0x10);
                                                  moveRowsTable::anon_class_8_1_ce415857::operator()
                                                            (&local_148);
                                                  local_1b8.r = -1;
                                                  local_1b8.c = -1;
                                                  local_1b8.i = 0;
                                                  local_1b8.m = (QAbstractItemModel *)0x0;
                                                  GenericModel::index(iVar7,(int)&local_190,
                                                                      (QModelIndex *)0x1);
                                                  QPersistentModelIndex::QPersistentModelIndex
                                                            ((QPersistentModelIndex *)local_198,
                                                             (QModelIndex *)&local_1e8);
                                                  local_1e8._forAlignment = -NAN;
                                                  local_1e8._8_8_ = (QVariant *)0x0;
                                                  local_1e8._16_8_ = 0;
                                                  local_1b8.r = -1;
                                                  local_1b8.c = -1;
                                                  local_1b8.i = 0;
                                                  local_1b8.m = (QAbstractItemModel *)0x0;
                                                  bVar4 = (bool)GenericModel::moveRows
                                                                          (&local_190,iVar7,0,
                                                                           (QModelIndex *)0x2,
                                                                           (int)&local_1b8);
                                                  cVar2 = QTest::qVerify(bVar4,
                                                  "testModel.moveRows(QModelIndex(), 0, 2, QModelIndex(), 3)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x658);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x0);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar6,2,
                                                  "testModel.index(0, 0).data().toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x659);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x1);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar6,0,
                                                  "testModel.index(1, 0).data().toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x65a);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x2);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar6,1,
                                                  "testModel.index(2, 0).data().toInt()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x65b);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x3);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar6,3,
                                                  "testModel.index(3, 0).data().toInt()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x65c);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x4);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar6,4,
                                                  "testModel.index(4, 0).data().toInt()","4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x65d);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x5);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    iVar6 = QVariant::toInt((bool *)local_1e8.data);
                                                    cVar2 = QTest::qCompare(iVar6,5,
                                                  "testModel.index(5, 0).data().toInt()","5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x65e);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (cVar2 != '\0') {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x0);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_1ba = QVariant::value<QChar>
                                                                          ((QVariant *)&local_1e8);
                                                    local_19a.ucs = L'c';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1ba,&local_19a,
                                                                                                                                              
                                                  "testModel.index(0, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'c\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x65f);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x1);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_1ba = QVariant::value<QChar>
                                                                          ((QVariant *)&local_1e8);
                                                    local_19a.ucs = L'a';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1ba,&local_19a,
                                                                                                                                              
                                                  "testModel.index(1, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'a\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x660);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x2);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_1ba = QVariant::value<QChar>
                                                                          ((QVariant *)&local_1e8);
                                                    local_19a.ucs = L'b';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1ba,&local_19a,
                                                                                                                                              
                                                  "testModel.index(2, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x661);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x3);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_1ba = QVariant::value<QChar>
                                                                          ((QVariant *)&local_1e8);
                                                    local_19a.ucs = L'd';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1ba,&local_19a,
                                                                                                                                              
                                                  "testModel.index(3, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'d\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x662);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x4);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_1ba = QVariant::value<QChar>
                                                                          ((QVariant *)&local_1e8);
                                                    local_19a.ucs = L'e';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1ba,&local_19a,
                                                                                                                                              
                                                  "testModel.index(4, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'e\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x663);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    local_178 = 0xffffffffffffffff;
                                                    local_170 = 0;
                                                    uStack_168 = 0;
                                                    GenericModel::index((int)&local_1b8,
                                                                        (int)&local_190,
                                                                        (QModelIndex *)0x5);
                                                    if (local_1b8.m == (QAbstractItemModel *)0x0) {
                                                      local_1e8.shared = (PrivateShared *)0x0;
                                                      local_1e8._8_8_ = (QVariant *)0x0;
                                                      local_1e8._16_8_ = 0;
                                                      local_1d0 = 2;
                                                    }
                                                    else {
                                                      (**(code **)(*(long *)local_1b8.m + 0x90))
                                                                (&local_1e8,local_1b8.m,&local_1b8,0
                                                                );
                                                    }
                                                    local_1ba = QVariant::value<QChar>
                                                                          ((QVariant *)&local_1e8);
                                                    local_19a.ucs = L'f';
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      (&local_1ba,&local_19a,
                                                                                                                                              
                                                  "testModel.index(5, 1).data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'f\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x664);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    QPersistentModelIndex::data(iVar7);
                                                    QVar5 = QVariant::value<QChar>
                                                                      ((QVariant *)&local_1e8);
                                                    local_1b8.r._0_2_ = QVar5.ucs;
                                                    local_178 = CONCAT62(local_178._2_6_,0x62);
                                                    bVar4 = QTest::qCompare<QChar,QChar>
                                                                      ((QChar *)&local_1b8,
                                                                       (QChar *)&local_178,
                                                                                                                                              
                                                  "oneIndex.data().value<QChar>()",
                                                  "QChar(QLatin1Char(\'b\'))",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x665);
                                                  QVariant::~QVariant((QVariant *)&local_1e8);
                                                  if (bVar4) {
                                                    iVar7 = QPersistentModelIndex::row();
                                                    cVar2 = QTest::qCompare(iVar7,2,"oneIndex.row()"
                                                                            ,"2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x666);
                                                  if (cVar2 != '\0') {
                                                    lVar8 = 0;
                                                    do {
                                                      lVar1 = *(long *)((long)local_158 + lVar8);
                                                      cVar2 = QTest::qCompare(*(longlong *)
                                                                               (lVar1 + 0x20),1,
                                                                              "spy->count()","1",
                                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x668);
                                                  if (cVar2 == '\0') break;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            ((value_type *)&local_1e8,
                                                             (QList<QList<QVariant>_> *)
                                                             (lVar1 + 0x10));
                                                  QVariant::value<QModelIndex>
                                                            (&local_1b8,(QVariant *)local_1e8._8_8_)
                                                  ;
                                                  bVar4 = true;
                                                  if ((-1 < local_1b8.r) &&
                                                     (-1 < (long)local_1b8._0_8_)) {
                                                    bVar4 = local_1b8.m == (QAbstractItemModel *)0x0
                                                    ;
                                                  }
                                                  cVar2 = QTest::qVerify(bVar4,
                                                  "!args.at(0).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x66a);
                                                  if (cVar2 == '\0') {
LAB_00122936:
                                                    QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                              ((QArrayDataPointer<QVariant> *)
                                                               &local_1e8);
                                                    break;
                                                  }
                                                  iVar7 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x20));
                                                  cVar2 = QTest::qCompare(iVar7,0,
                                                  "args.at(1).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x66b);
                                                  if (cVar2 == '\0') goto LAB_00122936;
                                                  iVar7 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x40));
                                                  cVar2 = QTest::qCompare(iVar7,1,
                                                  "args.at(2).toInt()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x66c);
                                                  if (cVar2 == '\0') goto LAB_00122936;
                                                  QVariant::value<QModelIndex>
                                                            (&local_1b8,
                                                             (QVariant *)(local_1e8._8_8_ + 0x60));
                                                  bVar4 = true;
                                                  if ((-1 < local_1b8.r) &&
                                                     (-1 < (long)local_1b8._0_8_)) {
                                                    bVar4 = local_1b8.m == (QAbstractItemModel *)0x0
                                                    ;
                                                  }
                                                  cVar2 = QTest::qVerify(bVar4,
                                                  "!args.at(3).value<QModelIndex>().isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x66d);
                                                  if (cVar2 == '\0') goto LAB_00122936;
                                                  iVar7 = QVariant::toInt((bool *)(local_1e8._8_8_ +
                                                                                  0x80));
                                                  bVar3 = QTest::qCompare(iVar7,3,
                                                  "args.at(4).toInt()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x66e);
                                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                            ((QArrayDataPointer<QVariant> *)
                                                             &local_1e8);
                                                  bVar4 = lVar8 != 8;
                                                  lVar8 = lVar8 + 8;
                                                  } while ((bVar3 & bVar4) != 0);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  QPersistentModelIndex::~QPersistentModelIndex
                                                            ((QPersistentModelIndex *)local_198);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_00121df4;
              }
            }
          }
        }
      }
    }
  }
  goto LAB_00121e01;
LAB_00121dec:
  QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)&local_1e8);
LAB_00121df4:
  QPersistentModelIndex::~QPersistentModelIndex(local_160);
LAB_00121e01:
  local_b0._0_8_ = &PTR_metaObject_00165910;
  QObject::~QObject((QObject *)((long)&local_b0 + 0x58));
  if (&(local_b0.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_b0.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_b0 + 0x10));
  QObject::~QObject(&local_b0.super_QObject);
LAB_00121e88:
  local_130._0_8_ = &PTR_metaObject_00165910;
  QObject::~QObject((QObject *)((long)&local_130 + 0x58));
  if (&(local_130.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_130.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_130.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_130.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_130.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_130.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_130 + 0x10));
  QObject::~QObject(&local_130.super_QObject);
  QObject::~QObject((QObject *)local_140);
  GenericModel::~GenericModel((GenericModel *)&local_190);
  return;
}

Assistant:

void tst_GenericModel::moveRowsTable()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    testModel.insertColumns(0, 2);
    testModel.insertRows(0, 6);
    QSignalSpy rowsAboutToBeMovedSpy(&testModel, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsAboutToBeMovedSpy.isValid());
    QSignalSpy rowsMovedSpy(&testModel, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsMovedSpy.isValid());
    QSignalSpy *spyArr[] = {&rowsAboutToBeMovedSpy, &rowsMovedSpy};
    const auto resetData = [&testModel]() {
        for (int i = 0; i < 6; ++i) {
            testModel.setData(testModel.index(i, 0), i);
            testModel.setData(testModel.index(i, 1), QChar('a' + i));
        }
    };
    resetData();
    QVERIFY(!testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), -1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 7));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(QModelIndex(), -1, 1, QModelIndex(), 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(QModelIndex(), 6, 1, QModelIndex(), 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(QModelIndex(), 1, 2, QModelIndex(), 2));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(QModelIndex(), 1, 2, QModelIndex(), 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);

    QPersistentModelIndex twoIndex = testModel.index(2, 1);
    QVERIFY(testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 4));
    QCOMPARE(testModel.index(0, 0).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0).data().toInt(), 2);
    QCOMPARE(testModel.index(4, 0).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(4, 1).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 3);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 4);
    }

    resetData();
    twoIndex = testModel.index(2, 1);
    QVERIFY(testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 0));
    QCOMPARE(testModel.index(0, 0).data().toInt(), 2);
    QCOMPARE(testModel.index(1, 0).data().toInt(), 0);
    QCOMPARE(testModel.index(2, 0).data().toInt(), 1);
    QCOMPARE(testModel.index(3, 0).data().toInt(), 3);
    QCOMPARE(testModel.index(4, 0).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(1, 1).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(2, 1).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(3, 1).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(4, 1).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 0);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 0);
    }

    resetData();
    twoIndex = testModel.index(2, 1);
    QVERIFY(testModel.moveRows(QModelIndex(), 2, 1, QModelIndex(), 6));
    QCOMPARE(testModel.index(0, 0).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0).data().toInt(), 4);
    QCOMPARE(testModel.index(4, 0).data().toInt(), 5);
    QCOMPARE(testModel.index(5, 0).data().toInt(), 2);
    QCOMPARE(testModel.index(0, 1).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(4, 1).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(testModel.index(5, 1).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 5);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 6);
    }

    resetData();
    QPersistentModelIndex oneIndex = testModel.index(1, 1);
    QVERIFY(testModel.moveRows(QModelIndex(), 0, 2, QModelIndex(), 3));
    QCOMPARE(testModel.index(0, 0).data().toInt(), 2);
    QCOMPARE(testModel.index(1, 0).data().toInt(), 0);
    QCOMPARE(testModel.index(2, 0).data().toInt(), 1);
    QCOMPARE(testModel.index(3, 0).data().toInt(), 3);
    QCOMPARE(testModel.index(4, 0).data().toInt(), 4);
    QCOMPARE(testModel.index(5, 0).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 1).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(1, 1).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(2, 1).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(3, 1).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(4, 1).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(5, 1).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(oneIndex.data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(oneIndex.row(), 2);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QVERIFY(!args.at(0).value<QModelIndex>().isValid());
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 1);
        QVERIFY(!args.at(3).value<QModelIndex>().isValid());
        QCOMPARE(args.at(4).toInt(), 3);
    }
}